

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall sqvector<SQObjectPtr>::~sqvector(sqvector<SQObjectPtr> *this)

{
  SQUnsignedInteger in_RDI;
  SQUnsignedInteger i;
  byte *this_00;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    for (this_00 = (byte *)0x0; this_00 < *(undefined1 **)(in_RDI + 8);
        this_00 = (byte *)((long)&(((SQObjectPtr *)this_00)->super_SQObject)._type + 1)) {
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
    }
    sq_vm_free(this_00,in_RDI);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }